

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O2

base_learner * scorer_setup(options_i *options,vw *all)

{
  int iVar1;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *op
  ;
  base_learner *l;
  single_learner *psVar2;
  learner<scorer,_example> *l_00;
  ostream *poVar3;
  vw_exception *this;
  code *pcVar4;
  allocator local_2b3;
  allocator local_2b2;
  allocator local_2b1;
  free_ptr<scorer> s;
  string link;
  string local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  string local_220;
  string local_200;
  option_group_definition new_options;
  stringstream __msg;
  ostream local_198;
  
  scoped_calloc_or_throw<scorer>();
  link._M_dataplus._M_p = (pointer)&link.field_2;
  link._M_string_length = 0;
  link.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_220,"scorer options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_240,"link",&local_2b1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_240,&link);
  std::__cxx11::string::string((string *)&local_260,"identity",&local_2b2);
  op = VW::config::
       typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::default_value((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&__msg,&local_260);
  (op->super_base_option).m_keep = true;
  std::__cxx11::string::string
            (local_280,"Specify the link function: identity, logistic, glf1 or poisson",&local_2b3);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,op);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string((string *)&local_260);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_240);
  (**options->_vptr_options_i)(options,&new_options);
  (s._M_t.super___uniq_ptr_impl<scorer,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_scorer_*,_void_(*)(void_*)>.super__Head_base<0UL,_scorer_*,_false>.
  _M_head_impl)->all = all;
  l = setup_base(options,all);
  psVar2 = LEARNER::as_singleline<char,char>(l);
  iVar1 = std::__cxx11::string::compare((char *)&link);
  if (iVar1 == 0) {
    l_00 = LEARNER::init_learner<scorer,example,LEARNER::learner<char,example>>
                     (&s,psVar2,predict_or_learn<true,&(id(float))>,
                      predict_or_learn<false,&(id(float))>);
    pcVar4 = multipredict<&(id(float))>;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&link);
    if (iVar1 == 0) {
      l_00 = LEARNER::init_learner<scorer,example,LEARNER::learner<char,example>>
                       (&s,psVar2,predict_or_learn<true,&(logistic(float))>,
                        predict_or_learn<false,&(logistic(float))>);
      pcVar4 = multipredict<&(logistic(float))>;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&link);
      if (iVar1 == 0) {
        l_00 = LEARNER::init_learner<scorer,example,LEARNER::learner<char,example>>
                         (&s,psVar2,predict_or_learn<true,&(glf1(float))>,
                          predict_or_learn<false,&(glf1(float))>);
        pcVar4 = multipredict<&(glf1(float))>;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&link);
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          poVar3 = std::operator<<(&local_198,"Unknown link function: ");
          std::operator<<(poVar3,(string *)&link);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/scorer.cc"
                     ,0x5c,&local_200);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        l_00 = LEARNER::init_learner<scorer,example,LEARNER::learner<char,example>>
                         (&s,psVar2,predict_or_learn<true,&expf>,predict_or_learn<false,&expf>);
        pcVar4 = multipredict<&expf>;
      }
    }
  }
  *(code **)(l_00 + 0x40) = pcVar4;
  *(code **)(l_00 + 0x38) = update;
  psVar2 = LEARNER::as_singleline<scorer,example>(l_00);
  all->scorer = psVar2;
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&link);
  std::unique_ptr<scorer,_void_(*)(void_*)>::~unique_ptr(&s);
  return (base_learner *)psVar2;
}

Assistant:

LEARNER::base_learner* scorer_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<scorer>();
  string link;
  option_group_definition new_options("scorer options");
  new_options.add(make_option("link", link)
                      .default_value("identity")
                      .keep()
                      .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  // This always returns a base_learner.

  s->all = &all;

  auto base = as_singleline(setup_base(options, all));
  LEARNER::learner<scorer, example>* l;
  void (*multipredict_f)(scorer&, LEARNER::single_learner&, example&, size_t, size_t, polyprediction*, bool) =
      multipredict<id>;

  if (link.compare("identity") == 0)
    l = &init_learner(s, base, predict_or_learn<true, id>, predict_or_learn<false, id>);
  else if (link.compare("logistic") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, logistic>, predict_or_learn<false, logistic>);
    multipredict_f = multipredict<logistic>;
  }
  else if (link.compare("glf1") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, glf1>, predict_or_learn<false, glf1>);
    multipredict_f = multipredict<glf1>;
  }
  else if (link.compare("poisson") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, expf>, predict_or_learn<false, expf>);
    multipredict_f = multipredict<expf>;
  }
  else
    THROW("Unknown link function: " << link);

  l->set_multipredict(multipredict_f);
  l->set_update(update);
  all.scorer = LEARNER::as_singleline(l);

  return make_base(*all.scorer);
}